

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall cmLocalGenerator::AddGeneratorTarget(cmLocalGenerator *this,cmGeneratorTarget *gt)

{
  pointer *pppcVar1;
  iterator __position;
  string *psVar2;
  cmGeneratorTarget *local_20;
  
  __position._M_current =
       (this->GeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = gt;
  if (__position._M_current ==
      (this->GeneratorTargets).
      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
    _M_realloc_insert<cmGeneratorTarget*const&>
              ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)
               &this->GeneratorTargets,__position,&local_20);
  }
  else {
    *__position._M_current = gt;
    pppcVar1 = &(this->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(local_20);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget*>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string_const&,cmGeneratorTarget*&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget*>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->GeneratorTargetSearchIndex,psVar2,&local_20);
  cmGlobalGenerator::IndexGeneratorTarget(this->GlobalGenerator,local_20);
  return;
}

Assistant:

void cmLocalGenerator::AddGeneratorTarget(cmGeneratorTarget* gt)
{
  this->GeneratorTargets.push_back(gt);
  this->GeneratorTargetSearchIndex.emplace(gt->GetName(), gt);
  this->GlobalGenerator->IndexGeneratorTarget(gt);
}